

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::~IfcMemberType(IfcMemberType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x88fbb8;
  *(undefined8 *)&this->field_0x30 = 0x88fcd0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x88fbe0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x88fc08;
  *(undefined8 *)&this[-1].field_0x138 = 0x88fc30;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x88fc58;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x88fc80;
  *(undefined8 *)this = 0x88fca8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x88ff98;
  *(undefined8 *)&this->field_0x30 = 0x890060;
  *(undefined8 *)&this[-1].field_0xd0 = 0x88ffc0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x88ffe8;
  *(undefined8 *)&this[-1].field_0x138 = 0x890010;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x890038;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>.field_0x20
     ) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__0088fcf8);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}